

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

string * __thiscall
pbrt::MLTIntegrator::ToString_abi_cxx11_(string *__return_storage_ptr__,MLTIntegrator *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::CameraHandle_const&,int_const&,int_const&,int_const&,int_const&,float_const&,float_const&,pbrt::LightSamplerHandle_const&,bool_const&>
            (__return_storage_ptr__,
             "[ MLTIntegrator camera: %s maxDepth: %d nBootstrap: %d nChains: %d mutationsPerPixel: %d sigma: %f largeStepProbability: %f lightSampler: %s regularize: %s ]"
             ,&this->camera,&this->maxDepth,&this->nBootstrap,&this->nChains,
             &this->mutationsPerPixel,&this->sigma,&this->largeStepProbability,&this->lightSampler,
             &this->regularize);
  return __return_storage_ptr__;
}

Assistant:

std::string MLTIntegrator::ToString() const {
    return StringPrintf("[ MLTIntegrator camera: %s maxDepth: %d nBootstrap: %d "
                        "nChains: %d mutationsPerPixel: %d sigma: %f "
                        "largeStepProbability: %f lightSampler: %s regularize: %s ]",
                        camera, maxDepth, nBootstrap, nChains, mutationsPerPixel, sigma,
                        largeStepProbability, lightSampler, regularize);
}